

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O1

void __thiscall
MeshDenoisingViaL0Minimization::solveDelta
          (MeshDenoisingViaL0Minimization *this,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *area_based_edge_operator,double lambda,double beta,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *delta)

{
  pointer pVVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  value_type local_78;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  
  local_78.super_VectorDataT<double,_3>.values_[0] = 0.0;
  local_78.super_VectorDataT<double,_3>.values_[1] = 0.0;
  local_78.super_VectorDataT<double,_3>.values_[2] = 0.0;
  local_40 = beta;
  local_38 = lambda;
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (delta,(long)((int)((ulong)((long)(area_based_edge_operator->
                                              super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(area_based_edge_operator->
                                             super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                         -0x55555555),&local_78);
  pVVar1 = (area_based_edge_operator->
           super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(area_based_edge_operator->
                              super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) >> 3) *
          -0x55555555) {
    local_38 = local_38 / local_40;
    lVar3 = 0x10;
    lVar2 = 0;
    do {
      local_40 = *(double *)((long)(pVVar1->super_VectorDataT<double,_3>).values_ + lVar3 + -0x10);
      local_58 = *(double *)((long)(pVVar1->super_VectorDataT<double,_3>).values_ + lVar3 + -8);
      local_50 = *(double *)((long)(pVVar1->super_VectorDataT<double,_3>).values_ + lVar3);
      local_30 = local_50 * local_50 + local_40 * local_40 + local_58 * local_58;
      dVar5 = SQRT(local_30);
      dVar4 = dVar5;
      if (local_30 < 0.0) {
        local_48 = dVar5;
        dVar5 = sqrt(local_30);
        dVar4 = local_48;
      }
      if (local_30 < 0.0) {
        dVar4 = local_30;
        local_30 = dVar5;
        dVar4 = sqrt(dVar4);
        dVar5 = local_30;
      }
      if (local_38 <= dVar5 * dVar4) {
        pVVar1 = (delta->
                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(double *)((long)(pVVar1->super_VectorDataT<double,_3>).values_ + lVar3 + -0x10) = local_40
        ;
        *(double *)((long)(pVVar1->super_VectorDataT<double,_3>).values_ + lVar3 + -8) = local_58;
        *(double *)((long)(pVVar1->super_VectorDataT<double,_3>).values_ + lVar3) = local_50;
      }
      lVar2 = lVar2 + 1;
      pVVar1 = (area_based_edge_operator->
               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x18;
    } while (lVar2 < (int)((ulong)((long)(area_based_edge_operator->
                                         super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1)
                          >> 3) * -0x55555555);
  }
  return;
}

Assistant:

void MeshDenoisingViaL0Minimization::solveDelta(std::vector<TriMesh::Point> &area_based_edge_operator, double lambda, double beta,
                                                std::vector<TriMesh::Point> &delta)
{
    delta.resize((int)area_based_edge_operator.size(), TriMesh::Point(0.0, 0.0, 0.0));

    for(int i = 0; i < (int)area_based_edge_operator.size(); i++)
    {
        TriMesh::Point pt = area_based_edge_operator[i];
        if(pt.length() * pt.length() >= lambda/beta)
            delta[i] = pt;
    }
}